

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<int>(void)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  if (ConstCastTestT<int>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::w);
    if (iVar1 != 0) {
      ConstCastTestT<int>::w = L'\x01';
      __cxa_guard_release(&ConstCastTestT<int>()::w);
    }
  }
  if (ConstCastTestT<int>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::c);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::c = SafeInt::operator_cast_to_char((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::c);
    }
  }
  if (ConstCastTestT<int>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::sc);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::sc =
           SafeInt::operator_cast_to_signed_char((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::sc);
    }
  }
  if (ConstCastTestT<int>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::uc);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::uc =
           SafeInt::operator_cast_to_unsigned_char((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::uc);
    }
  }
  if (ConstCastTestT<int>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::s);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::s = SafeInt::operator_cast_to_short((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::s);
    }
  }
  if (ConstCastTestT<int>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::us);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::us =
           SafeInt::operator_cast_to_unsigned_short((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::us);
    }
  }
  if (ConstCastTestT<int>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::i);
    if (iVar1 != 0) {
      ConstCastTestT<int>::i = 1;
      __cxa_guard_release(&ConstCastTestT<int>()::i);
    }
  }
  if (ConstCastTestT<int>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ui);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::ui =
           SafeInt::operator_cast_to_unsigned_int((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::ui);
    }
  }
  if (ConstCastTestT<int>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::l);
    if (iVar1 != 0) {
      ConstCastTestT<int>::l = 1;
      __cxa_guard_release(&ConstCastTestT<int>()::l);
    }
  }
  if (ConstCastTestT<int>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ul);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::ul =
           SafeInt::operator_cast_to_unsigned_long((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::ul);
    }
  }
  if (ConstCastTestT<int>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ll);
    if (iVar1 != 0) {
      ConstCastTestT<int>::ll = 1;
      __cxa_guard_release(&ConstCastTestT<int>()::ll);
    }
  }
  if (ConstCastTestT<int>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ull);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::ull =
           SafeInt::operator_cast_to_unsigned_long_long((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::ull);
    }
  }
  if (ConstCastTestT<int>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::st);
    if (iVar1 != 0) {
      uStack_8 = CONCAT44(1,(undefined4)uStack_8);
      ConstCastTestT<int>::st =
           SafeInt::operator_cast_to_unsigned_long((SafeInt *)((long)&uStack_8 + 4));
      __cxa_guard_release(&ConstCastTestT<int>()::st);
    }
  }
  if (ConstCastTestT<int>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::pt);
    if (iVar1 != 0) {
      ConstCastTestT<int>::pt = 1;
      __cxa_guard_release(&ConstCastTestT<int>()::pt);
    }
  }
  if (ConstCastTestT<int>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::pl);
    if (iVar1 != 0) {
      ConstCastTestT<int>::pl = 1;
      __cxa_guard_release(&ConstCastTestT<int>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}